

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetCheckBackward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int i;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int i_00;
  long lVar5;
  bool bVar6;
  
  i_00 = 0;
  do {
    if (vSet->nSize <= i_00) {
      return 1;
    }
    i = Vec_IntEntry(vSet,i_00);
    iVar1 = Vec_IntEntry(&p->pNtk->vRefs,i);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = -1;
    for (lVar5 = 0; iVar2 = Vec_IntEntry(&p->pNtk->vRefs,i), lVar5 < iVar2; lVar5 = lVar5 + 1) {
      piVar4 = Wln_RetFanouts(p,i);
      iVar2 = piVar4[lVar5 * 2];
      piVar4 = Wln_RetFanouts(p,i);
      piVar4 = Vec_IntEntryP(&p->vFanins,piVar4[lVar5 * 2 + 1]);
      if (piVar4 == (int *)0x0) break;
      iVar3 = iVar1;
      if (iVar2 != 0) {
        if (*piVar4 == 0) {
          return 0;
        }
        piVar4 = Wln_RetHeadToTail(p,piVar4);
        iVar2 = Vec_IntEntry(&p->vEdgeLinks,*piVar4 + 1);
        iVar3 = Wln_ObjIsFf(p->pNtk,iVar2);
        if (iVar3 == 0) {
          __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnRetime.c"
                        ,0x18b,"int Wln_RetCheckBackwardOne(Wln_Ret_t *, int)");
        }
        iVar3 = Vec_IntEntry(&p->vFfClasses,iVar2);
        if ((iVar1 != -1) && (bVar6 = iVar1 != iVar3, iVar3 = iVar1, bVar6)) {
          return 0;
        }
      }
      iVar1 = iVar3;
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

int Wln_RetCheckBackward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj;
    Vec_IntForEachEntry( vSet, iObj, i )
        if ( !Wln_RetCheckBackwardOne( p, iObj ) )
            return 0;
    return 1;
}